

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  int iVar1;
  BCPos BVar2;
  anon_union_8_3_2ce71dea_for_u aVar3;
  uint uVar4;
  ExpKind EVar5;
  BinOpr BVar6;
  BCReg BVar7;
  BCReg BVar8;
  BCReg BVar9;
  BCPos BVar10;
  undefined4 uVar11;
  TValue TVar12;
  undefined8 uVar13;
  anon_union_8_3_2ce71dea_for_u *paVar14;
  uint32_t uVar15;
  BinOpr BVar16;
  ulong uVar17;
  uint uVar18;
  BCPos *l1;
  BCIns ins;
  FuncState *pFVar19;
  GCstr *pGVar20;
  TValue *o;
  ExpDesc v2;
  anon_union_8_3_2ce71dea_for_u local_70;
  int iStack_68;
  BCPos BStack_64;
  BCPos local_60;
  undefined4 uStack_5c;
  anon_union_8_3_2ce71dea_for_u *local_58;
  anon_union_8_3_2ce71dea_for_u *local_50;
  LexState *local_48;
  uint32_t local_3c;
  BCPos *local_38;
  
  uVar4 = ls->level + 1;
  ls->level = uVar4;
  local_3c = limit;
  if (199 < uVar4) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  iVar1 = ls->tok;
  if (0x113 < iVar1) {
    if (iVar1 < 0x11e) {
      if (iVar1 == 0x114) {
        uVar13 = 0xffffffff00000002;
        goto LAB_00127411;
      }
      if (iVar1 != 0x118) {
switchD_00127285_caseD_108:
        expr_primary(ls,v);
        goto LAB_001275af;
      }
      pFVar19 = ls->fs;
      if ((pFVar19->flags & 2) == 0) {
        err_syntax(ls,LJ_ERR_XDOTS);
      }
      bcreg_reserve(pFVar19,1);
      uVar15 = pFVar19->freereg - 1;
      BVar10 = bcemit_INS(pFVar19,(uint)pFVar19->numparams << 0x10 | uVar15 * 0x100 | 0x2000047);
      v->k = VCALL;
      (v->u).s.info = BVar10;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
      (v->u).s.aux = uVar15;
    }
    else {
      if (iVar1 == 0x11e) {
        v->k = (ls->tokval).field_2.it == 0xfffffff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        TVar12 = ls->tokval;
      }
      else {
        if (iVar1 != 0x120) goto switchD_00127285_caseD_108;
        v->k = VKSTR;
        v->t = 0xffffffff;
        (v->u).s.info = 0;
        v->f = 0xffffffff;
        TVar12.field_2.it = 0;
        TVar12.field_2.field_0 =
             (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
             (ls->tokval).u32.lo;
      }
      v->u = (anon_union_8_3_2ce71dea_for_u)TVar12;
    }
    goto LAB_0012744d;
  }
  if (iVar1 < 0x107) {
    if (iVar1 == 0x23) {
      lj_lex_next(ls);
      expr_binop(ls,v,8);
      pFVar19 = ls->fs;
      uVar4 = 0x15;
    }
    else {
      if (iVar1 != 0x2d) {
        if (iVar1 != 0x7b) goto switchD_00127285_caseD_108;
        expr_table(ls,v);
        goto LAB_001275af;
      }
      lj_lex_next(ls);
      expr_binop(ls,v,8);
      pFVar19 = ls->fs;
      uVar4 = 0x14;
      if (v->t == v->f) {
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_001274cf;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_001274cf;
          uVar17 = (ulong)(v->u).s.info;
          if (*(short *)(uVar17 + 6) == 0x10) {
            *(byte *)(uVar17 + 0x17) = *(byte *)(uVar17 + 0x17) ^ 0x80;
          }
          else {
            *(long *)(uVar17 + 8) = -*(long *)(uVar17 + 8);
          }
        }
        goto LAB_001275af;
      }
    }
LAB_001274cf:
    expr_toanyreg(pFVar19,v);
    EVar5 = v->k;
LAB_001274de:
    uVar18 = (v->u).s.info;
    if (EVar5 == VNONRELOC) {
LAB_001274e6:
      if (pFVar19->nactvar <= uVar18) {
        pFVar19->freereg = pFVar19->freereg - 1;
        uVar18 = (v->u).s.info;
      }
    }
    BVar10 = bcemit_INS(pFVar19,uVar18 << 0x10 | uVar4);
    (v->u).s.info = BVar10;
    v->k = VRELOCABLE;
    goto LAB_001275af;
  }
  switch(iVar1) {
  case 0x107:
    uVar13 = 0xffffffff00000001;
    goto LAB_00127411;
  default:
    goto switchD_00127285_caseD_108;
  case 0x109:
    lj_lex_next(ls);
    parse_body(ls,v,0,ls->linenumber);
    break;
  case 0x10e:
    uVar13 = 0xffffffff00000000;
LAB_00127411:
    v->k = (int)uVar13;
    v->t = (int)((ulong)uVar13 >> 0x20);
    (v->u).s.info = 0;
    v->f = 0xffffffff;
LAB_0012744d:
    lj_lex_next(ls);
    break;
  case 0x10f:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar19 = ls->fs;
    BVar10 = v->t;
    BVar2 = v->f;
    v->f = BVar10;
    v->t = BVar2;
    jmp_dropval(pFVar19,BVar10);
    jmp_dropval(pFVar19,v->t);
    expr_discharge(pFVar19,v);
    EVar5 = v->k;
    if (EVar5 < VKTRUE) {
      v->k = VKTRUE;
    }
    else if (EVar5 - VKTRUE < 4) {
      v->k = VKFALSE;
    }
    else {
      if (EVar5 != VJMP) {
        uVar4 = 0x13;
        if (EVar5 != VRELOCABLE) goto LAB_001274de;
        bcreg_reserve(pFVar19,1);
        *(char *)((long)&pFVar19->bcbase[(v->u).s.info].ins + 1) = (char)pFVar19->freereg + -1;
        uVar18 = pFVar19->freereg - 1;
        (v->u).s.info = uVar18;
        v->k = VNONRELOC;
        uVar4 = 0x13;
        goto LAB_001274e6;
      }
      *(byte *)&pFVar19->bcbase[(v->u).s.info - 1].ins =
           (byte)pFVar19->bcbase[(v->u).s.info - 1].ins ^ 1;
    }
  }
LAB_001275af:
  iVar1 = ls->tok;
  BVar16 = OPR_NOBINOPR;
  if (iVar1 < 0x5e) {
    switch(iVar1) {
    case 0x25:
      uVar17 = 4;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_001275d3_caseD_26;
    case 0x2a:
      uVar17 = 2;
      break;
    case 0x2b:
      uVar17 = 0;
      break;
    case 0x2d:
      uVar17 = 1;
      break;
    case 0x2f:
      uVar17 = 3;
      break;
    default:
      if (iVar1 == 0x3c) {
        uVar17 = 9;
      }
      else {
        if (iVar1 != 0x3e) goto switchD_001275d3_caseD_26;
        uVar17 = 0xc;
      }
    }
  }
  else {
    switch(iVar1) {
    case 0x110:
      uVar17 = 0xe;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x118:
      goto switchD_001275d3_caseD_26;
    case 0x117:
      uVar17 = 6;
      break;
    case 0x119:
      uVar17 = 8;
      break;
    case 0x11a:
      uVar17 = 10;
      break;
    case 0x11b:
      uVar17 = 0xb;
      break;
    case 0x11c:
      uVar17 = 7;
      break;
    default:
      if (iVar1 == 0x5e) {
        uVar17 = 5;
      }
      else {
        if (iVar1 != 0x101) goto switchD_001275d3_caseD_26;
        uVar17 = 0xd;
      }
    }
  }
  local_38 = &v->t;
  local_48 = ls;
  do {
    BVar16 = (BinOpr)uVar17;
    if (priority[uVar17].left <= local_3c) goto switchD_001275d3_caseD_26;
    lj_lex_next(ls);
    pFVar19 = ls->fs;
    if (BVar16 == OPR_CONCAT) {
      expr_tonextreg(pFVar19,v);
    }
    else if (BVar16 == OPR_OR) {
      expr_discharge(pFVar19,v);
      EVar5 = v->k;
      if (EVar5 - VKTRUE < 3) {
        expr_toreg_nobranch(pFVar19,v,0xff);
        BVar10 = bcemit_jmp(pFVar19);
      }
      else {
        BVar10 = 0xffffffff;
        if (VKFALSE < EVar5) {
          if (EVar5 == VJMP) {
            BVar10 = (v->u).s.info;
          }
          else {
            BVar10 = bcemit_branch(pFVar19,v,1);
          }
        }
      }
      jmp_append(pFVar19,local_38,BVar10);
      BVar10 = v->f;
      pFVar19->lasttarget = pFVar19->pc;
      jmp_append(pFVar19,&pFVar19->jpc,BVar10);
      v->f = 0xffffffff;
      ls = local_48;
    }
    else if (BVar16 == OPR_AND) {
      bcemit_branch_t(pFVar19,v);
    }
    else {
      if (BVar16 - OPR_NE < 2) {
        if (v->k < VKCDATA) {
LAB_0012773c:
          if (v->t == v->f) goto LAB_001277bd;
        }
      }
      else if (v->k == VKLAST) goto LAB_0012773c;
      expr_toanyreg(pFVar19,v);
    }
LAB_001277bd:
    BVar6 = expr_binop(ls,(ExpDesc *)&local_70.s,(uint)priority[uVar17].right);
    pFVar19 = ls->fs;
    if (BVar16 < OPR_CONCAT) {
      if ((((v->k == VKLAST) && (v->t == v->f)) && (iStack_68 == 4)) &&
         ((BStack_64 == local_60 &&
          (pGVar20 = (GCstr *)lj_vm_foldarith(v->u,(double)CONCAT44(local_70.s.aux,local_70.s.info),
                                              BVar16),
          ((ulong)pGVar20 & 0x7fffffffffffffff) < 0x7ff0000000000001)))) {
        (v->u).sval = pGVar20;
      }
      else {
        if (BVar16 == OPR_POW) {
          BVar7 = expr_toanyreg(pFVar19,(ExpDesc *)&local_70.s);
          BVar8 = expr_toanyreg(pFVar19,v);
          BVar16 = 0x25;
        }
        else {
          expr_toval(pFVar19,(ExpDesc *)&local_70.s);
          if ((iStack_68 == 4) && (BVar9 = const_num(pFVar19,(ExpDesc *)&local_70.s), BVar9 < 0x100)
             ) {
            BVar16 = BVar16 + 0x16;
          }
          else {
            BVar16 = BVar16 | 0x20;
            BVar9 = expr_toanyreg(pFVar19,(ExpDesc *)&local_70.s);
          }
          expr_toval(pFVar19,v);
          if (((v->k == VKLAST) && (iStack_68 != 4)) &&
             (BVar7 = const_num(pFVar19,v), BVar7 < 0x100)) {
            BVar16 = BVar16 - OPR_POW;
            BVar8 = BVar9;
          }
          else {
            BVar8 = expr_toanyreg(pFVar19,v);
            BVar7 = BVar9;
          }
        }
        if ((v->k == VNONRELOC) && (pFVar19->nactvar <= (v->u).s.info)) {
          pFVar19->freereg = pFVar19->freereg - 1;
        }
        if ((iStack_68 == 0xc) && (pFVar19->nactvar <= local_70.s.info)) {
          pFVar19->freereg = pFVar19->freereg - 1;
        }
        BVar10 = bcemit_INS(pFVar19,BVar7 << 0x10 | BVar8 << 0x18 | BVar16);
        (v->u).s.info = BVar10;
        v->k = VRELOCABLE;
        ls = local_48;
      }
    }
    else if (BVar16 == OPR_CONCAT) {
      expr_toval(pFVar19,(ExpDesc *)&local_70.s);
      if (iStack_68 == 0xb) {
        if ((char)pFVar19->bcbase[local_70.s.info].ins != '&') goto LAB_00127ad1;
        uVar4 = (v->u).s.info;
        if ((v->k == VNONRELOC) && (pFVar19->nactvar <= uVar4)) {
          pFVar19->freereg = pFVar19->freereg - 1;
          uVar4 = (v->u).s.info;
        }
        *(char *)((long)&pFVar19->bcbase[local_70.s.info].ins + 3) = (char)uVar4;
        uVar11 = local_70.s.info;
      }
      else {
LAB_00127ad1:
        expr_tonextreg(pFVar19,(ExpDesc *)&local_70.s);
        if ((iStack_68 == 0xc) && (pFVar19->nactvar <= local_70.s.info)) {
          pFVar19->freereg = pFVar19->freereg - 1;
        }
        uVar4 = (v->u).s.info;
        if ((v->k == VNONRELOC) && (pFVar19->nactvar <= uVar4)) {
          pFVar19->freereg = pFVar19->freereg - 1;
          uVar4 = (v->u).s.info;
        }
        uVar11 = bcemit_INS(pFVar19,local_70.s.info << 0x10 | uVar4 << 0x18 | 0x26);
      }
      (v->u).s.info = uVar11;
      v->k = VRELOCABLE;
    }
    else {
      if (BVar16 == OPR_OR) {
        expr_discharge(pFVar19,(ExpDesc *)&local_70.s);
        BVar10 = v->t;
        l1 = &BStack_64;
      }
      else {
        if (BVar16 != OPR_AND) {
          expr_toval(pFVar19,v);
          if (BVar16 - OPR_NE < 2) {
            uVar4 = BVar16 == OPR_EQ ^ 5;
            local_50 = &v->u;
            paVar14 = &local_70;
            if (v->k < VKCDATA) {
              local_50 = &local_70;
              paVar14 = &v->u;
            }
            BVar9 = expr_toanyreg(pFVar19,(ExpDesc *)&local_50->s);
            expr_toval(pFVar19,(ExpDesc *)&paVar14->s);
            local_58 = paVar14;
            EVar5 = paVar14[1].s.info;
            if (EVar5 < VKSTR) {
              ins = EVar5 << 0x10 | uVar4 + BVar9 * 0x100 + 6;
              paVar14 = local_50;
            }
            else if (EVar5 == VKSTR) {
              BVar7 = const_gc(pFVar19,(GCobj *)((anon_union_8_3_2ce71dea_for_u *)&(paVar14->s).info
                                                )->sval,0xfffffffb);
              ins = (BVar7 << 0x10 | BVar9 << 8) + uVar4 + 2;
              paVar14 = local_50;
            }
            else if (EVar5 == VKLAST) {
              BVar7 = const_num(pFVar19,(ExpDesc *)&paVar14->s);
              ins = BVar7 << 0x10 | uVar4 + BVar9 * 0x100 + 4;
              paVar14 = local_50;
            }
            else {
              BVar7 = expr_toanyreg(pFVar19,(ExpDesc *)&paVar14->s);
              ins = BVar7 << 0x10 | BVar9 * 0x100 | uVar4;
              paVar14 = local_50;
            }
          }
          else {
            uVar4 = BVar16 - OPR_LT;
            if ((uVar4 & 1) == 0) {
              BVar9 = expr_toanyreg(pFVar19,(ExpDesc *)&local_70.s);
              BVar7 = expr_toanyreg(pFVar19,v);
              local_58 = &local_70;
              paVar14 = &v->u;
            }
            else {
              uVar4 = uVar4 ^ 3;
              expr_toval(pFVar19,(ExpDesc *)&local_70.s);
              BVar7 = expr_toanyreg(pFVar19,(ExpDesc *)&local_70.s);
              BVar9 = expr_toanyreg(pFVar19,v);
              local_58 = &v->u;
              paVar14 = &local_70;
            }
            ins = BVar9 << 0x10 | BVar7 << 8 | uVar4;
          }
          if ((paVar14[1].s.info == 0xc) && (pFVar19->nactvar <= (paVar14->s).info)) {
            pFVar19->freereg = pFVar19->freereg - 1;
          }
          if ((local_58[1].s.info == VNONRELOC) &&
             (pFVar19->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(local_58->s).info)->s).info))
          {
            pFVar19->freereg = pFVar19->freereg - 1;
          }
          bcemit_INS(pFVar19,ins);
          BVar10 = bcemit_jmp(pFVar19);
          (v->u).s.info = BVar10;
          v->k = VJMP;
          ls = local_48;
          goto LAB_00127ca1;
        }
        expr_discharge(pFVar19,(ExpDesc *)&local_70.s);
        BVar10 = v->f;
        l1 = &local_60;
      }
      jmp_append(pFVar19,l1,BVar10);
      *(ulong *)&v->f = CONCAT44(uStack_5c,local_60);
      aVar3.s.aux = local_70.s.aux;
      aVar3.s.info = local_70.s.info;
      v->u = aVar3;
      v->k = iStack_68;
      v->t = BStack_64;
    }
LAB_00127ca1:
    uVar17 = (ulong)BVar6;
  } while (BVar6 != OPR_NOBINOPR);
  BVar16 = OPR_NOBINOPR;
switchD_001275d3_caseD_26:
  ls->level = ls->level - 1;
  return BVar16;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->tok);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}